

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::mark_location_as_used_by_shader
          (CompilerMSL *this,uint32_t location,SPIRType *type,StorageClass storage)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_t sVar4;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  value_type local_68;
  uint local_64;
  _Node_iterator_base<unsigned_int,_false> _Stack_60;
  uint32_t i_2;
  undefined1 local_58;
  uint32_t local_4c;
  _Node_iterator_base<unsigned_int,_false> local_48;
  undefined1 local_40;
  uint32_t local_38;
  uint local_34;
  uint local_30;
  uint32_t j;
  uint32_t i_1;
  uint32_t i;
  uint32_t dim;
  StorageClass storage_local;
  SPIRType *type_local;
  CompilerMSL *pCStack_10;
  uint32_t location_local;
  CompilerMSL *this_local;
  
  if (storage == StorageClassInput) {
    i = storage;
    _dim = type;
    type_local._4_4_ = location;
    pCStack_10 = this;
    bVar1 = Compiler::is_array((Compiler *)this,type);
    if (bVar1) {
      i_1 = 1;
      for (j = 0; uVar3 = (ulong)j,
          sVar4 = VectorView<unsigned_int>::size(&(_dim->array).super_VectorView<unsigned_int>),
          uVar3 < sVar4; j = j + 1) {
        uVar2 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,_dim,j);
        i_1 = uVar2 * i_1;
      }
      for (local_30 = 0; local_30 < i_1; local_30 = local_30 + 1) {
        bVar1 = Compiler::is_matrix((Compiler *)this,_dim);
        if (bVar1) {
          for (local_34 = 0; local_34 < _dim->columns; local_34 = local_34 + 1) {
            local_38 = type_local._4_4_;
            type_local._4_4_ = type_local._4_4_ + 1;
            pVar5 = ::std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::insert(&this->inputs_in_use,&local_38);
            local_48._M_cur =
                 (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
            local_40 = pVar5.second;
          }
        }
        else {
          local_4c = type_local._4_4_;
          type_local._4_4_ = type_local._4_4_ + 1;
          pVar5 = ::std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::insert(&this->inputs_in_use,&local_4c);
          _Stack_60._M_cur =
               (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
          local_58 = pVar5.second;
        }
      }
    }
    else {
      bVar1 = Compiler::is_matrix((Compiler *)this,_dim);
      if (bVar1) {
        for (local_64 = 0; local_64 < _dim->columns; local_64 = local_64 + 1) {
          local_68 = type_local._4_4_ + local_64;
          ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(&this->inputs_in_use,&local_68);
        }
      }
      else {
        ::std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::insert(&this->inputs_in_use,(value_type *)((long)&type_local + 4));
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::mark_location_as_used_by_shader(uint32_t location, const SPIRType &type, StorageClass storage)
{
	if (storage != StorageClassInput)
		return;
	if (is_array(type))
	{
		uint32_t dim = 1;
		for (uint32_t i = 0; i < type.array.size(); i++)
			dim *= to_array_size_literal(type, i);
		for (uint32_t i = 0; i < dim; i++)
		{
			if (is_matrix(type))
			{
				for (uint32_t j = 0; j < type.columns; j++)
					inputs_in_use.insert(location++);
			}
			else
				inputs_in_use.insert(location++);
		}
	}
	else if (is_matrix(type))
	{
		for (uint32_t i = 0; i < type.columns; i++)
			inputs_in_use.insert(location + i);
	}
	else
		inputs_in_use.insert(location);
}